

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O1

void __thiscall KDIS::KDataStream::Write<unsigned_int>(KDataStream *this,uint T)

{
  long lVar1;
  undefined4 *puVar2;
  KUINT8 i;
  NetToDataType<unsigned_int> OctArray;
  KOCTET Temp [4];
  uchar local_21;
  undefined4 local_20;
  uint local_1c;
  
  local_20 = T;
  if (this->m_MachineEndian != this->m_NetEndian) {
    local_1c = T;
    lVar1 = 4;
    puVar2 = &local_20;
    do {
      *(undefined1 *)puVar2 = *(undefined1 *)((long)&local_20 + lVar1 + 3);
      puVar2 = (undefined4 *)((long)puVar2 + 1);
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  lVar1 = 0;
  do {
    local_21 = *(uchar *)((long)&local_20 + lVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->m_vBuffer,&local_21);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return;
}

Assistant:

void KDataStream::Write( Type T )
{
    KBOOL bSwapBytes = true;
    if (m_MachineEndian == m_NetEndian)
        bSwapBytes = false;

    NetToDataType<Type> OctArray( T, bSwapBytes );

    for( KUINT8 i = 0; i < sizeof T; ++i )
    {
        m_vBuffer.push_back( OctArray.m_Octs[i] );
    }
}